

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_calc_hash(ptls_hash_algorithm_t *algo,void *output,void *src,size_t len)

{
  ptls_hash_context_t *ppVar1;
  ptls_hash_context_t *ctx;
  size_t len_local;
  void *src_local;
  void *output_local;
  ptls_hash_algorithm_t *algo_local;
  
  ppVar1 = (*algo->create)();
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    algo_local._4_4_ = 0x201;
  }
  else {
    (*ppVar1->update)(ppVar1,src,len);
    (*ppVar1->final)(ppVar1,output,PTLS_HASH_FINAL_MODE_FREE);
    algo_local._4_4_ = 0;
  }
  return algo_local._4_4_;
}

Assistant:

int ptls_calc_hash(ptls_hash_algorithm_t *algo, void *output, const void *src, size_t len)
{
    ptls_hash_context_t *ctx;

    if ((ctx = algo->create()) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->update(ctx, src, len);
    ctx->final(ctx, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}